

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

string * __thiscall
flatbuffers::dart::DartGenerator::Filename
          (string *__return_storage_ptr__,DartGenerator *this,string *suffix,bool path)

{
  string *psVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  undefined7 in_register_00000009;
  size_type *psVar5;
  long *local_a8 [2];
  long local_98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  local_a8[0] = local_98;
  if ((int)CONCAT71(in_register_00000009,path) == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  }
  else {
    psVar1 = (this->super_BaseGenerator).path_;
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,pcVar2,pcVar2 + psVar1->_M_string_length);
  }
  psVar1 = (this->super_BaseGenerator).file_name_;
  if (suffix->_M_string_length == 0) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88);
  }
  else {
    std::operator+(&local_88,"_",suffix);
  }
  plVar4 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_88,0,(char *)0x0,(ulong)(psVar1->_M_dataplus)._M_p);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_68.field_2._M_allocated_capacity = *psVar5;
    local_68.field_2._8_8_ = plVar4[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar5;
    local_68._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_68._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  Namer::File(&local_48,&(this->namer_).super_Namer,&local_68,None);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)local_a8[0]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar3 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Filename(const std::string &suffix, bool path = true) const {
    return (path ? path_ : "") +
           namer_.File(file_name_ + (suffix.empty() ? "" : "_" + suffix));
  }